

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::Maybe<kj::Exception>::Maybe(Maybe<kj::Exception> *this,Maybe<kj::Exception> *other)

{
  byte bVar1;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = (bool)bVar1;
  if ((bool)bVar1 == true) {
    Exception::Exception(&(this->ptr).field_1.value,&(other->ptr).field_1.value);
    bVar1 = (other->ptr).isSet;
  }
  if ((bVar1 & 1) != 0) {
    (other->ptr).isSet = false;
    Exception::~Exception(&(other->ptr).field_1.value);
    return;
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }